

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

_Bool bitset_container_iterate64
                (bitset_container_t *cont,uint32_t base,roaring_iterator64 iterator,
                uint64_t high_bits,void *ptr)

{
  int iVar1;
  ulong uVar2;
  ulong in_RCX;
  code *in_RDX;
  int in_ESI;
  long in_RDI;
  undefined8 in_R8;
  int r;
  uint64_t t;
  uint64_t w;
  int32_t i;
  ulong local_40;
  int local_34;
  int local_14;
  
  local_34 = 0;
  local_14 = in_ESI;
  do {
    if (0x3ff < local_34) {
      return true;
    }
    for (local_40 = *(ulong *)(*(long *)(in_RDI + 8) + (long)local_34 * 8); local_40 != 0;
        local_40 = local_40 & (local_40 ^ 0xffffffffffffffff) + 1 ^ local_40) {
      iVar1 = roaring_trailing_zeroes(local_40);
      uVar2 = (*in_RDX)(in_RCX | (uint)(iVar1 + local_14),in_R8);
      if ((uVar2 & 1) == 0) {
        return false;
      }
    }
    local_14 = local_14 + 0x40;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

bool bitset_container_iterate64(const bitset_container_t *cont, uint32_t base, roaring_iterator64 iterator, uint64_t high_bits, void *ptr) {
  for (int32_t i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS; ++i ) {
    uint64_t w = cont->words[i];
    while (w != 0) {
      uint64_t t = w & (~w + 1);
      int r = roaring_trailing_zeroes(w);
      if(!iterator(high_bits | (uint64_t)(r + base), ptr)) return false;
      w ^= t;
    }
    base += 64;
  }
  return true;
}